

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool vkb::detail::check_extension_supported
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                *available_extensions,char *extension_name)

{
  pointer pVVar1;
  int iVar2;
  pointer __s2;
  bool bVar3;
  
  if (extension_name == (char *)0x0) {
    bVar3 = false;
  }
  else {
    __s2 = (available_extensions->
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_start;
    pVVar1 = (available_extensions->
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    bVar3 = __s2 != pVVar1;
    if (bVar3) {
      iVar2 = strcmp(extension_name,__s2->extensionName);
      while (iVar2 != 0) {
        __s2 = __s2 + 1;
        bVar3 = __s2 != pVVar1;
        if (__s2 == pVVar1) {
          return bVar3;
        }
        iVar2 = strcmp(extension_name,__s2->extensionName);
      }
    }
  }
  return bVar3;
}

Assistant:

bool check_extension_supported(std::vector<VkExtensionProperties> const& available_extensions, const char* extension_name) {
    if (!extension_name) return false;
    for (const auto& extension_properties : available_extensions) {
        if (strcmp(extension_name, extension_properties.extensionName) == 0) {
            return true;
        }
    }
    return false;
}